

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O2

void __thiscall
DCanvas::Clear(DCanvas *this,int left,int top,int right,int bottom,int palcolor,uint32 color)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  BYTE *__s;
  ulong uVar4;
  
  if (top != bottom && left != right) {
    if (right <= left) {
      __assert_fail("left < right",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                    ,0x4b2,"virtual void DCanvas::Clear(int, int, int, int, int, uint32)");
    }
    if (bottom <= top) {
      __assert_fail("top < bottom",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                    ,0x4b3,"virtual void DCanvas::Clear(int, int, int, int, int, uint32)");
    }
    iVar1 = this->Width;
    if ((0 < right && left < iVar1) && (iVar2 = this->Height, 0 < bottom && top < iVar2)) {
      uVar4 = (ulong)(uint)left;
      if (left < 1) {
        uVar4 = 0;
      }
      if (iVar1 < right) {
        right = iVar1;
      }
      uVar3 = 0;
      if (0 < top) {
        uVar3 = top;
      }
      if (iVar2 < bottom) {
        bottom = iVar2;
      }
      if (palcolor < 0) {
        if (color >> 0x18 != 0xff) {
          (*(this->super_DObject)._vptr_DObject[0xe])
                    ((float)(color >> 0x18) / 255.0,this,(ulong)color,uVar4,(ulong)uVar3,
                     (ulong)(uint)(right - (int)uVar4),(ulong)(bottom - uVar3));
          return;
        }
        palcolor = PalFromRGB(color);
      }
      __s = this->Buffer + uVar4 + (long)(int)uVar3 * (long)this->Pitch;
      for (; (int)uVar3 < bottom; uVar3 = uVar3 + 1) {
        memset(__s,palcolor & 0xff,(long)(right - (int)uVar4));
        __s = __s + this->Pitch;
      }
    }
  }
  return;
}

Assistant:

void DCanvas::Clear (int left, int top, int right, int bottom, int palcolor, uint32 color)
{
	int x, y;
	BYTE *dest;

	if (left == right || top == bottom)
	{
		return;
	}

	assert(left < right);
	assert(top < bottom);

	if (left >= Width || right <= 0 || top >= Height || bottom <= 0)
	{
		return;
	}
	left = MAX(0,left);
	right = MIN(Width,right);
	top = MAX(0,top);
	bottom = MIN(Height,bottom);

	if (palcolor < 0)
	{
		if (APART(color) != 255)
		{
			Dim(color, APART(color)/255.f, left, top, right - left, bottom - top);
			return;
		}

		palcolor = PalFromRGB(color);
	}

	dest = Buffer + top * Pitch + left;
	x = right - left;
	for (y = top; y < bottom; y++)
	{
		memset(dest, palcolor, x);
		dest += Pitch;
	}
}